

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yyrefill(GREG *G)

{
  int iVar1;
  PVIPParserStringState *pPVar2;
  size_t __size;
  int iVar3;
  char *pcVar4;
  
  while( true ) {
    iVar1 = G->pos;
    if (0x1ff < G->buflen - iVar1) break;
    __size = (long)G->buflen * 2;
    G->buflen = (int)__size;
    pcVar4 = (char *)realloc(G->buf,__size);
    G->buf = pcVar4;
  }
  pcVar4 = G->buf;
  if ((G->data).is_string == 0) {
    iVar3 = fgetc((FILE *)(G->data).fp);
    pcVar4[iVar1] = (char)iVar3;
    if ((char)iVar3 == -1) {
      return 0;
    }
  }
  else {
    pPVar2 = (G->data).str;
    if (pPVar2->len == pPVar2->pos) {
      return 0;
    }
    pcVar4[iVar1] = pPVar2->buf[pPVar2->pos];
    pPVar2->pos = pPVar2->pos + 1;
  }
  G->limit = G->limit + 1;
  return 1;
}

Assistant:

YY_LOCAL(int) yyrefill(GREG *G)
{
  int yyn;
  while (G->buflen - G->pos < 512)
    {
      G->buflen *= 2;
      G->buf= (char*)YY_REALLOC(G->buf, G->buflen, G->data);
    }
  YY_INPUT((G->buf + G->pos), yyn, (G->buflen - G->pos), G->data);
  if (!yyn) return 0;
  G->limit += yyn;
  return 1;
}